

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O1

char * cmFileAPI::ObjectKindName(ObjectKind kind)

{
  return ObjectKindName::objectKindNames[(int)kind];
}

Assistant:

const char* cmFileAPI::ObjectKindName(ObjectKind kind)
{
  // Keep in sync with ObjectKind enum.
  static const char* objectKindNames[] = {
    "codemodel",  //
    "cache",      //
    "cmakeFiles", //
    "toolchains", //
    "__test"      //
  };
  return objectKindNames[static_cast<size_t>(kind)];
}